

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc.c
# Opt level: O1

int32_t WebRtcAgc_ProcessDigital
                  (DigitalAgc *stt,int16_t **in_near,size_t num_bands,int16_t **out,uint32_t FS,
                  int16_t lowlevelSignal)

{
  DigitalAgc *pDVar1;
  short sVar2;
  short sVar3;
  uint uVar4;
  int iVar5;
  int16_t *piVar6;
  byte bVar7;
  ushort uVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  undefined6 in_register_0000008a;
  uint uVar15;
  int iVar16;
  int16_t iVar17;
  long lVar18;
  int iVar19;
  size_t sVar20;
  int32_t gains [11];
  int32_t env [10];
  sbyte local_a0;
  uint local_9c [15];
  DigitalAgc *local_60;
  uint local_58 [10];
  
  local_9c[0] = (uint)CONCAT62(in_register_0000008a,lowlevelSignal);
  if ((int)FS < 32000) {
    if (FS == 8000) {
      local_a0 = 1;
      lVar10 = 8;
      goto LAB_0012fbf0;
    }
    if (FS != 16000) {
      return -1;
    }
  }
  else if ((FS != 48000) && (FS != 32000)) {
    return -1;
  }
  local_a0 = 0;
  lVar10 = 0x10;
LAB_0012fbf0:
  iVar9 = (int)lVar10;
  local_60 = stt;
  if (num_bands != 0) {
    sVar20 = 0;
    do {
      if (in_near[sVar20] != out[sVar20]) {
        memcpy(out[sVar20],in_near[sVar20],(ulong)(uint)(iVar9 * 4) * 5);
      }
      sVar20 = sVar20 + 1;
    } while (num_bands != sVar20);
  }
  pDVar1 = local_60;
  sVar2 = WebRtcAgc_ProcessVad(&local_60->vadNearend,*out,(ulong)(uint)(iVar9 * 2) * 5);
  if (10 < (pDVar1->vadFarend).counter) {
    sVar2 = (short)((uint)(sVar2 * 3 - (int)(pDVar1->vadFarend).logRatio) >> 2);
  }
  sVar3 = -0x41;
  if (sVar2 < 0x401) {
    if (sVar2 < 0) {
      sVar3 = 0;
    }
    else {
      sVar3 = (short)((uint)(-sVar2 * 0x41) >> 10);
    }
  }
  if (pDVar1->agcMode != 3) {
    iVar5 = (int)(pDVar1->vadNearend).stdLongTerm;
    sVar2 = 0;
    if ((3999 < iVar5) && (sVar2 = sVar3, iVar5 < 0x1fa0)) {
      sVar2 = (short)((uint)((int)sVar3 * (iVar5 + -4000)) >> 0xc);
    }
    sVar3 = 0;
    if ((short)local_9c[0] == 0) {
      sVar3 = sVar2;
    }
  }
  piVar6 = *out;
  lVar12 = 0;
  do {
    lVar13 = 0;
    uVar11 = 0;
    do {
      uVar14 = (int)piVar6[lVar13] * (int)piVar6[lVar13];
      if ((int)uVar14 <= (int)uVar11) {
        uVar14 = uVar11;
      }
      lVar13 = lVar13 + 1;
      uVar11 = uVar14;
    } while (lVar10 != lVar13);
    local_58[lVar12] = uVar14;
    lVar12 = lVar12 + 1;
    piVar6 = (int16_t *)((long)piVar6 + (ulong)(uint)(iVar9 * 2));
  } while (lVar12 != 10);
  iVar9 = pDVar1->gain;
  uVar11 = pDVar1->capacitorSlow;
  uVar14 = pDVar1->capacitorFast;
  lVar12 = 1;
  do {
    uVar14 = ((int)((uVar14 & 0xffff) * -1000) >> 0x10) + ((int)uVar14 >> 0x10) * -1000 + uVar14;
    uVar15 = local_58[lVar12 + -1];
    if ((int)uVar14 < (int)uVar15) {
      uVar14 = uVar15;
    }
    uVar4 = uVar15 - uVar11;
    if (uVar4 == 0 || (int)uVar15 < (int)uVar11) {
      uVar11 = ((int)((uVar11 & 0xffff) * (int)sVar3) >> 0x10) +
               ((int)uVar11 >> 0x10) * (int)sVar3 + uVar11;
    }
    else {
      uVar11 = ((uVar4 & 0xffff) * 500 >> 0x10) + ((int)uVar4 >> 0x10) * 500 + uVar11;
    }
    uVar15 = uVar11;
    if ((int)uVar11 < (int)uVar14) {
      uVar15 = uVar14;
    }
    uVar4 = 0x1f;
    if (uVar15 != 0) {
      for (; uVar15 >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    uVar4 = uVar4 ^ 0x1f;
    if (uVar15 == 0) {
      uVar4 = 0x1f;
    }
    uVar15 = (uVar15 << ((byte)uVar4 & 0x1f)) >> 0x13;
    local_9c[lVar12 + 1] =
         ((int)((pDVar1->gainTable[(ulong)(ushort)uVar4 - 1] - pDVar1->gainTable[(ushort)uVar4]) *
               (uVar15 & 0xfff)) >> 0xc) + pDVar1->gainTable[(ushort)uVar4];
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0xb);
  iVar5 = 0x1f;
  if (uVar14 != 0) {
    for (; uVar14 >> iVar5 == 0; iVar5 = iVar5 + -1) {
    }
  }
  uVar8 = 0x1f;
  if (uVar14 != 0) {
    uVar8 = (ushort)iVar5 ^ 0x1f;
  }
  pDVar1->capacitorFast = uVar14;
  pDVar1->capacitorSlow = uVar11;
  sVar2 = (uVar8 * 0x200 -
          ((pDVar1->vadNearend).stdShortTerm +
           ((ushort)((uVar14 << ((byte)uVar8 & 0x1f)) >> 0x16) & 0x1ff) +
          (short)(uVar4 * 0x2000000 + (uVar15 & 0xff8) * -0x2000 >> 0x10))) + 1000;
  if (sVar2 < 0) {
    sVar3 = 0;
  }
  else {
    sVar3 = (short)((uint)(pDVar1->gatePrevious * 7 + (int)sVar2) >> 3);
    sVar2 = sVar3;
  }
  pDVar1->gatePrevious = sVar3;
  if (0 < sVar2) {
    iVar5 = ((uint)-(sVar2 + -0x9c4) >> 5) + 0xb2;
    if (0x9c3 < sVar2) {
      iVar5 = 0xb2;
    }
    iVar16 = pDVar1->gainTable[0];
    lVar12 = 1;
    do {
      uVar11 = local_9c[lVar12 + 1] - iVar16;
      iVar19 = (int)(uVar11 * iVar5) >> 8;
      if (0x800000 < (int)uVar11) {
        iVar19 = (uVar11 >> 8) * iVar5;
      }
      local_9c[lVar12 + 1] = iVar19 + iVar16;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0xb);
  }
  lVar12 = 0;
  do {
    uVar11 = local_9c[lVar12 + 2];
    uVar14 = 0x1f;
    if (uVar11 != 0) {
      for (; uVar11 >> uVar14 == 0; uVar14 = uVar14 - 1) {
      }
    }
    iVar5 = (uVar14 ^ 0xffffffe0) + 0x12;
    if ((int)uVar11 < 0x2d413cd) {
      iVar5 = 10;
    }
    bVar7 = (byte)iVar5;
    iVar16 = ((int)uVar11 >> (bVar7 & 0x1f)) + 1;
    uVar14 = iVar16 * iVar16;
    iVar16 = ((int)local_58[lVar12] >> 0xc) + 1;
    uVar11 = 0x7fff >> (bVar7 * '\x02' - 0x16 & 0x1f);
    if (iVar5 < 0xc) {
      uVar11 = 0x7fff << (bVar7 * -2 + 0x16 & 0x1f);
    }
    if ((int)uVar11 < (int)(((int)((uVar14 & 0x1fff) * iVar16) >> 0xd) + (uVar14 >> 0xd) * iVar16))
    {
      uVar14 = local_9c[lVar12 + 2];
      do {
        if ((int)uVar14 < 0x800000) {
          iVar19 = uVar14 * 0xfd;
          iVar5 = iVar19 + 0xff;
          if (-1 < iVar19) {
            iVar5 = iVar19;
          }
          uVar14 = iVar5 >> 8;
        }
        else {
          uVar14 = (uVar14 >> 8) * 0xfd;
        }
        iVar5 = ((int)uVar14 >> (bVar7 & 0x1f)) + 1;
        uVar15 = iVar5 * iVar5;
      } while ((int)uVar11 <
               (int)(((int)((uVar15 & 0x1fff) * iVar16) >> 0xd) + (uVar15 >> 0xd) * iVar16));
      local_9c[lVar12 + 2] = uVar14;
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 10);
  lVar12 = 2;
  do {
    uVar11 = local_9c[lVar12 + 1];
    if ((int)local_9c[lVar12] < (int)local_9c[lVar12 + 1]) {
      uVar11 = local_9c[lVar12];
    }
    local_9c[lVar12] = uVar11;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0xb);
  pDVar1->gain = local_9c[0xb];
  iVar5 = iVar9 << 4;
  lVar12 = 0;
  do {
    if (num_bands != 0) {
      sVar20 = 0;
      do {
        iVar16 = (int)out[sVar20][lVar12];
        iVar19 = (iVar5 + 0x7f >> 7) * iVar16 >> 0x10;
        iVar17 = 0x7fff;
        if ((iVar19 < 0x1000) && (iVar17 = -0x8000, -0x1001 < iVar19)) {
          iVar17 = (int16_t)((uint)(iVar16 * (iVar5 >> 4)) >> 0x10);
        }
        out[sVar20][lVar12] = iVar17;
        sVar20 = sVar20 + 1;
      } while (num_bands != sVar20);
    }
    iVar5 = iVar5 + (local_9c[2] - iVar9 << local_a0);
    lVar12 = lVar12 + 1;
  } while (lVar12 != lVar10);
  lVar12 = 1;
  do {
    uVar11 = local_9c[lVar12 + 1];
    uVar14 = local_9c[lVar12 + 2];
    iVar9 = uVar11 << 4;
    lVar13 = 0;
    do {
      if (num_bands != 0) {
        sVar20 = 0;
        do {
          lVar18 = (long)out[sVar20][lVar10 * lVar12 + lVar13] * (long)(iVar9 >> 4) >> 0x10;
          if (lVar18 < -0x7fff) {
            lVar18 = -0x8000;
          }
          if (0x7ffe < lVar18) {
            lVar18 = 0x7fff;
          }
          out[sVar20][lVar10 * lVar12 + lVar13] = (int16_t)lVar18;
          sVar20 = sVar20 + 1;
        } while (num_bands != sVar20);
      }
      iVar9 = iVar9 + (uVar14 - uVar11 << local_a0);
      lVar13 = lVar13 + 1;
    } while (lVar13 != lVar10);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 10);
  return 0;
}

Assistant:

int32_t WebRtcAgc_ProcessDigital(DigitalAgc *stt, const int16_t *const *in_near, size_t num_bands, int16_t *const *out,
                                 uint32_t FS, int16_t lowlevelSignal) {
    // array for gains (one value per ms, incl start & end)
    int32_t gains[11];

    int32_t out_tmp, tmp32;
    int32_t env[10];
    int32_t max_nrg;
    int32_t cur_level;
    int32_t gain32, delta;
    int16_t logratio;
    int16_t lower_thr, upper_thr;
    int16_t zeros = 0, zeros_fast, frac = 0;
    int16_t decay;
    int16_t gate, gain_adj;
    int16_t k;
    size_t n, i, L;
    int16_t L2;  // samples/subframe

    // determine number of samples per ms
    if (FS == 8000) {
        L = 8;
        L2 = 3;
    } else if (FS == 16000 || FS == 32000 || FS == 48000) {
        L = 16;
        L2 = 4;
    } else {
        return -1;
    }

    for (i = 0; i < num_bands; ++i) {
        if (in_near[i] != out[i]) {
            // Only needed if they don't already point to the same place.
            memcpy(out[i], in_near[i], 10 * L * sizeof(in_near[i][0]));
        }
    }
    // VAD for near end
    logratio = WebRtcAgc_ProcessVad(&stt->vadNearend, out[0], L * 10);

    // Account for far end VAD
    if (stt->vadFarend.counter > 10) {
        tmp32 = 3 * logratio;
        logratio = (int16_t) ((tmp32 - stt->vadFarend.logRatio) >> 2);
    }

    // Determine decay factor depending on VAD
    //  upper_thr = 1.0f;
    //  lower_thr = 0.25f;
    upper_thr = 1024;  // Q10
    lower_thr = 0;     // Q10
    if (logratio > upper_thr) {
        // decay = -2^17 / DecayTime;  ->  -65
        decay = -65;
    } else if (logratio < lower_thr) {
        decay = 0;
    } else {
        // decay = (int16_t)(((lower_thr - logratio)
        //       * (2^27/(DecayTime*(upper_thr-lower_thr)))) >> 10);
        // SUBSTITUTED: 2^27/(DecayTime*(upper_thr-lower_thr))  ->  65
        tmp32 = (lower_thr - logratio) * 65;
        decay = (int16_t) (tmp32 >> 10);
    }

    // adjust decay factor for long silence (detected as low standard deviation)
    // This is only done in the adaptive modes
    if (stt->agcMode != kAgcModeFixedDigital) {
        if (stt->vadNearend.stdLongTerm < 4000) {
            decay = 0;
        } else if (stt->vadNearend.stdLongTerm < 8096) {
            // decay = (int16_t)(((stt->vadNearend.stdLongTerm - 4000) * decay) >>
            // 12);
            tmp32 = (stt->vadNearend.stdLongTerm - 4000) * decay;
            decay = (int16_t) (tmp32 >> 12);
        }

        if (lowlevelSignal != 0) {
            decay = 0;
        }
    }
#ifdef WEBRTC_AGC_DEBUG_DUMP
    stt->frameCounter++;
    fprintf(stt->logFile, "%5.2f\t%d\t%d\t%d\t", (float)(stt->frameCounter) / 100, logratio, decay,
            stt->vadNearend.stdLongTerm);
#endif
    // Find max amplitude per sub frame
    // iterate over sub frames
    for (k = 0; k < 10; k++) {
        // iterate over samples
        max_nrg = 0;
        for (n = 0; n < L; n++) {
            int32_t nrg = out[0][k * L + n] * out[0][k * L + n];
            if (nrg > max_nrg) {
                max_nrg = nrg;
            }
        }
        env[k] = max_nrg;
    }

    // Calculate gain per sub frame
    gains[0] = stt->gain;
    for (k = 0; k < 10; k++) {
        // Fast envelope follower
        //  decay time = -131000 / -1000 = 131 (ms)
        stt->capacitorFast = AGC_SCALEDIFF32(-1000, stt->capacitorFast, stt->capacitorFast);
        if (env[k] > stt->capacitorFast) {
            stt->capacitorFast = env[k];
        }
        // Slow envelope follower
        if (env[k] > stt->capacitorSlow) {
            // increase capacitorSlow
            stt->capacitorSlow = AGC_SCALEDIFF32(500, (env[k] - stt->capacitorSlow), stt->capacitorSlow);
        } else {
            // decrease capacitorSlow
            stt->capacitorSlow = AGC_SCALEDIFF32(decay, stt->capacitorSlow, stt->capacitorSlow);
        }

        // use maximum of both capacitors as current level
        if (stt->capacitorFast > stt->capacitorSlow) {
            cur_level = stt->capacitorFast;
        } else {
            cur_level = stt->capacitorSlow;
        }
        // Translate signal level into gain, using a piecewise linear approximation
        // find number of leading zeros
        zeros = NormU32((uint32_t) cur_level);
        if (cur_level == 0) {
            zeros = 31;
        }
        tmp32 = ((uint32_t) cur_level << zeros) & 0x7FFFFFFF;
        frac = (int16_t) (tmp32 >> 19);  // Q12.
        tmp32 = (stt->gainTable[zeros - 1] - stt->gainTable[zeros]) * frac;
        gains[k + 1] = stt->gainTable[zeros] + (tmp32 >> 12);
#ifdef WEBRTC_AGC_DEBUG_DUMP
        if (k == 0) {
            fprintf(stt->logFile, "%d\t%d\t%d\t%d\t%d\n", env[0], cur_level, stt->capacitorFast, stt->capacitorSlow,
                    zeros);
        }
#endif
    }

    // Gate processing (lower gain during absence of speech)
    zeros = (zeros << 9) - (frac >> 3);
    // find number of leading zeros
    zeros_fast = NormU32((uint32_t) stt->capacitorFast);
    if (stt->capacitorFast == 0) {
        zeros_fast = 31;
    }
    tmp32 = ((uint32_t) stt->capacitorFast << zeros_fast) & 0x7FFFFFFF;
    zeros_fast <<= 9;
    zeros_fast -= (int16_t) (tmp32 >> 22);

    gate = 1000 + zeros_fast - zeros - stt->vadNearend.stdShortTerm;

    if (gate < 0) {
        stt->gatePrevious = 0;
    } else {
        tmp32 = stt->gatePrevious * 7;
        gate = (int16_t) ((gate + tmp32) >> 3);
        stt->gatePrevious = gate;
    }
    // gate < 0     -> no gate
    // gate > 2500  -> max gate
    if (gate > 0) {
        if (gate < 2500) {
            gain_adj = (2500 - gate) >> 5;
        } else {
            gain_adj = 0;
        }
        for (k = 0; k < 10; k++) {
            if ((gains[k + 1] - stt->gainTable[0]) > 8388608) {
                // To prevent wraparound
                tmp32 = (gains[k + 1] - stt->gainTable[0]) >> 8;
                tmp32 *= 178 + gain_adj;
            } else {
                tmp32 = (gains[k + 1] - stt->gainTable[0]) * (178 + gain_adj);
                tmp32 >>= 8;
            }
            gains[k + 1] = stt->gainTable[0] + tmp32;
        }
    }

    // Limit gain to avoid overload distortion
    for (k = 0; k < 10; k++) {
        // To prevent wrap around
        zeros = 10;
        if (gains[k + 1] > 47453132) {
            zeros = 16 - NormW32(gains[k + 1]);
        }
        gain32 = (gains[k + 1] >> zeros) + 1;
        gain32 *= gain32;
        // check for overflow
        while (AGC_MUL32((env[k] >> 12) + 1, gain32) > SHIFT_W32((int32_t) 32767, 2 * (1 - zeros + 10))) {
            // multiply by 253/256 ==> -0.1 dB
            if (gains[k + 1] > 8388607) {
                // Prevent wrap around
                gains[k + 1] = (gains[k + 1] / 256) * 253;
            } else {
                gains[k + 1] = (gains[k + 1] * 253) / 256;
            }
            gain32 = (gains[k + 1] >> zeros) + 1;
            gain32 *= gain32;
        }
    }
    // gain reductions should be done 1 ms earlier than gain increases
    for (k = 1; k < 10; k++) {
        if (gains[k] > gains[k + 1]) {
            gains[k] = gains[k + 1];
        }
    }
    // save start gain for next frame
    stt->gain = gains[10];

    // Apply gain
    // handle first sub frame separately
    delta = (gains[1] - gains[0]) * (1 << (4 - L2));
    gain32 = gains[0] * (1 << 4);
    // iterate over samples
    for (n = 0; n < L; n++) {
        for (i = 0; i < num_bands; ++i) {
            tmp32 = out[i][n] * ((gain32 + 127) >> 7);
            out_tmp = tmp32 >> 16;
            if (out_tmp > 4095) {
                out[i][n] = (int16_t) 32767;
            } else if (out_tmp < -4096) {
                out[i][n] = (int16_t) -32768;
            } else {
                tmp32 = out[i][n] * (gain32 >> 4);
                out[i][n] = (int16_t) (tmp32 >> 16);
            }
        }
        //

        gain32 += delta;
    }
    // iterate over subframes
    for (k = 1; k < 10; k++) {
        delta = (gains[k + 1] - gains[k]) * (1 << (4 - L2));
        gain32 = gains[k] * (1 << 4);
        // iterate over samples
        for (n = 0; n < L; n++) {
            for (i = 0; i < num_bands; ++i) {
                int64_t tmp64 = ((int64_t) (out[i][k * L + n])) * (gain32 >> 4);
                tmp64 = tmp64 >> 16;
                if (tmp64 > 32767) {
                    out[i][k * L + n] = 32767;
                } else if (tmp64 < -32768) {
                    out[i][k * L + n] = -32768;
                } else {
                    out[i][k * L + n] = (int16_t) (tmp64);
                }
            }
            gain32 += delta;
        }
    }

    return 0;
}